

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack8_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  
  uVar1 = *in;
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar15._8_8_ = 0x1000000008;
  auVar15._0_8_ = 0x1000000008;
  auVar6 = vpbroadcastd_avx512vl();
  auVar7 = vpbroadcastd_avx512f();
  auVar3 = vpsrlvd_avx2(auVar7._0_16_,auVar15);
  auVar7 = vpbroadcastd_avx512f();
  auVar4 = vpsrlvd_avx2(auVar7._0_16_,auVar15);
  auVar2 = vpshufd_avx(auVar15,0x50);
  auVar5 = vpsrlvd_avx2(auVar16,auVar2);
  auVar5 = vpblendd_avx2(auVar5,auVar16,1);
  auVar7 = vinserti32x8_avx512dq(ZEXT1664(auVar15),auVar6,0);
  auVar16 = vpsrlvd_avx2(auVar6._0_16_,auVar2);
  auVar6._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar15;
  auVar6._16_16_ = ZEXT116(1) * auVar16;
  auVar6 = vpblendd_avx2(ZEXT2032(CONCAT416(auVar7._16_4_,auVar5)),auVar6,0x60);
  auVar7 = vpbroadcastd_avx512f();
  auVar8 = vpmovsxbd_avx512f(_DAT_001966a0);
  auVar7 = vpermt2d_avx512f(ZEXT3664(CONCAT432(auVar7._32_4_,auVar6)),auVar8,ZEXT1664(auVar3));
  auVar9 = vpbroadcastd_avx512f();
  auVar10._0_48_ = auVar7._0_48_;
  auVar10._48_4_ = auVar9._48_4_;
  auVar10._52_4_ = auVar7._52_4_;
  auVar10._56_4_ = auVar7._56_4_;
  auVar10._60_4_ = auVar7._60_4_;
  auVar9 = vpmovsxbd_avx512f(_DAT_001a43b0);
  auVar7 = vpshufd_avx512f(auVar10,0);
  auVar10 = vpermt2d_avx512f(auVar10,auVar9,ZEXT1664(auVar4));
  auVar11 = vbroadcasti32x4_avx512f(_DAT_001a4410);
  auVar10 = vpandd_avx512f(auVar10,auVar11);
  auVar12 = vbroadcasti32x4_avx512f(_DAT_001a4420);
  auVar7 = vpsrlvd_avx512f(auVar7,auVar12);
  auVar13._0_12_ = auVar10._0_12_;
  auVar13._12_4_ = auVar7._12_4_;
  auVar13._16_4_ = auVar10._16_4_;
  auVar13._20_4_ = auVar10._20_4_;
  auVar13._24_4_ = auVar10._24_4_;
  auVar13._28_4_ = auVar7._28_4_;
  auVar13._32_4_ = auVar10._32_4_;
  auVar13._36_4_ = auVar10._36_4_;
  auVar13._40_4_ = auVar10._40_4_;
  auVar13._44_4_ = auVar7._44_4_;
  auVar13._48_4_ = auVar10._48_4_;
  auVar13._52_4_ = auVar10._52_4_;
  auVar13._60_4_ = auVar7._60_4_;
  auVar13._56_4_ = auVar10._56_4_;
  auVar7 = vmovdqu64_avx512f(auVar13);
  *(undefined1 (*) [64])out = auVar7;
  uVar1 = in[4];
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar6 = vpbroadcastd_avx512vl();
  auVar7 = vpbroadcastd_avx512f();
  auVar3 = vpsrlvd_avx2(auVar7._0_16_,auVar15);
  auVar7 = vpbroadcastd_avx512f();
  auVar4 = vpsrlvd_avx2(auVar7._0_16_,auVar15);
  auVar5 = vpsrlvd_avx2(auVar17,auVar2);
  auVar5 = vpblendd_avx2(auVar5,auVar17,1);
  auVar7 = vinserti32x8_avx512dq(ZEXT1664(auVar4),auVar6,0);
  auVar2 = vpsrlvd_avx2(auVar6._0_16_,auVar2);
  auVar18._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
  auVar18._16_16_ = ZEXT116(1) * auVar2;
  auVar6 = vpblendd_avx2(ZEXT2032(CONCAT416(auVar7._16_4_,auVar5)),auVar18,0x60);
  auVar7 = vpbroadcastd_avx512f();
  auVar7 = vpermt2d_avx512f(ZEXT3664(CONCAT432(auVar7._32_4_,auVar6)),auVar8,ZEXT1664(auVar3));
  auVar8 = vpbroadcastd_avx512f();
  auVar14._0_48_ = auVar7._0_48_;
  auVar14._48_4_ = auVar8._48_4_;
  auVar14._52_4_ = auVar7._52_4_;
  auVar14._56_4_ = auVar7._56_4_;
  auVar14._60_4_ = auVar7._60_4_;
  auVar7 = vpermi2d_avx512f(auVar9,auVar14,ZEXT1664(auVar4));
  auVar8 = vpshufd_avx512f(auVar14,0);
  auVar7 = vpandd_avx512f(auVar7,auVar11);
  auVar8 = vpsrlvd_avx512f(auVar8,auVar12);
  auVar9._0_12_ = auVar7._0_12_;
  auVar9._12_4_ = auVar8._12_4_;
  auVar9._16_4_ = auVar7._16_4_;
  auVar9._20_4_ = auVar7._20_4_;
  auVar9._24_4_ = auVar7._24_4_;
  auVar9._28_4_ = auVar8._28_4_;
  auVar9._32_4_ = auVar7._32_4_;
  auVar9._36_4_ = auVar7._36_4_;
  auVar9._40_4_ = auVar7._40_4_;
  auVar9._44_4_ = auVar8._44_4_;
  auVar9._48_4_ = auVar7._48_4_;
  auVar9._52_4_ = auVar7._52_4_;
  auVar9._60_4_ = auVar8._60_4_;
  auVar9._56_4_ = auVar7._56_4_;
  auVar7 = vmovdqu64_avx512f(auVar9);
  *(undefined1 (*) [64])(out + 0x10) = auVar7;
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack8_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;

  return in;
}